

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O2

char * toCString(string *s)

{
  char *pcVar1;
  
  pcVar1 = callocArrayType<char>(s->_M_string_length + 1);
  if (s->_M_string_length != 0) {
    pcVar1 = (char *)memmove(pcVar1,(s->_M_dataplus)._M_p,s->_M_string_length);
    return pcVar1;
  }
  return pcVar1;
}

Assistant:

static inline char *toCString(const std::string &s)
{
    auto out = callocArrayType<char>(s.size()+1);
    std::copy(s.begin(), s.end(), out);
    return out;
}